

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::ContextArrayPack::render
          (ContextArrayPack *this,Primitive primitive,int firstVertex,int vertexCount,bool useVao,
          float coordScale,float colorScale)

{
  Context *pCVar1;
  pointer ppCVar2;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  undefined7 in_register_00000081;
  long lVar8;
  int arrayNdx;
  deUint32 vaoId;
  Surface *local_1f0;
  Primitive local_1e4;
  uint local_1e0;
  int local_1dc;
  undefined8 local_1d8 [4];
  stringstream attribName;
  ostream local_1a8;
  
  local_1f0 = (Surface *)CONCAT44(local_1f0._4_4_,coordScale);
  vaoId = 0;
  local_1e4 = primitive;
  local_1e0 = firstVertex;
  local_1dc = vertexCount;
  updateProgram(this);
  (*this->m_ctx->_vptr_Context[5])
            (this->m_ctx,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  (*this->m_ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*this->m_ctx->_vptr_Context[0x2d])(this->m_ctx,0x4000);
  uVar3 = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,(ulong)uVar3);
  dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar4,"glUseProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x48a);
  pCVar1 = this->m_ctx;
  uVar5 = (*pCVar1->_vptr_Context[0x66])(pCVar1,(ulong)uVar3,"u_coordScale");
  (*pCVar1->_vptr_Context[0x5a])(local_1f0._0_4_,pCVar1,(ulong)uVar5);
  pCVar1 = this->m_ctx;
  uVar5 = (*pCVar1->_vptr_Context[0x66])(pCVar1,(ulong)uVar3,"u_colorScale");
  (*pCVar1->_vptr_Context[0x5a])(colorScale,pCVar1,(ulong)uVar5);
  if ((int)CONCAT71(in_register_00000081,useVao) != 0) {
    (*this->m_ctx->_vptr_Context[0x4c])(this->m_ctx,1,&vaoId);
    (*this->m_ctx->_vptr_Context[0x4b])(this->m_ctx,(ulong)vaoId);
  }
  local_1f0 = &this->m_screen;
  lVar8 = 0;
  while( true ) {
    ppCVar2 = (this->m_arrays).
              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_arrays).
                            super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <=
        lVar8) break;
    iVar6 = (*(ppCVar2[lVar8]->super_Array)._vptr_Array[6])();
    if ((char)iVar6 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&attribName);
      poVar7 = std::operator<<(&local_1a8,"a_");
      iVar6 = (*((this->m_arrays).
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8]->super_Array)._vptr_Array[0xe])();
      std::ostream::operator<<(poVar7,iVar6);
      pCVar1 = this->m_ctx;
      std::__cxx11::stringbuf::str();
      uVar5 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar3,local_1d8[0]);
      std::__cxx11::string::~string((string *)local_1d8);
      (*this->m_ctx->_vptr_Context[0x50])(this->m_ctx,(ulong)uVar5);
      dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar4,"glEnableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x49e);
      ContextArray::glBind
                ((this->m_arrays).
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8],uVar5);
      std::__cxx11::stringstream::~stringstream((stringstream *)&attribName);
    }
    lVar8 = lVar8 + 1;
  }
  (*this->m_ctx->_vptr_Context[0x68])
            (this->m_ctx,(ulong)ContextArray::primitiveToGL::primitives[(int)local_1e4],
             (ulong)local_1e0,(ulong)(local_1dc - local_1e0));
  dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
  glu::checkError(dVar4,"glDrawArrays()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                  ,0x4a6);
  lVar8 = 0;
  while( true ) {
    ppCVar2 = (this->m_arrays).
              super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_arrays).
                            super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <=
        lVar8) break;
    iVar6 = (*(ppCVar2[lVar8]->super_Array)._vptr_Array[6])();
    if ((char)iVar6 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&attribName);
      poVar7 = std::operator<<(&local_1a8,"a_");
      iVar6 = (*((this->m_arrays).
                 super__Vector_base<deqp::gls::ContextArray_*,_std::allocator<deqp::gls::ContextArray_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar8]->super_Array)._vptr_Array[0xe])();
      std::ostream::operator<<(poVar7,iVar6);
      pCVar1 = this->m_ctx;
      std::__cxx11::stringbuf::str();
      uVar5 = (*pCVar1->_vptr_Context[0x59])(pCVar1,(ulong)uVar3,local_1d8[0]);
      std::__cxx11::string::~string((string *)local_1d8);
      (*this->m_ctx->_vptr_Context[0x51])(this->m_ctx,(ulong)uVar5);
      dVar4 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar4,"glDisableVertexAttribArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x4b2);
      std::__cxx11::stringstream::~stringstream((stringstream *)&attribName);
    }
    lVar8 = lVar8 + 1;
  }
  if (useVao) {
    (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&vaoId);
  }
  (*this->m_ctx->_vptr_Context[0x77])(this->m_ctx,(ulong)uVar3);
  (*this->m_ctx->_vptr_Context[0x76])(this->m_ctx,0);
  (*this->m_ctx->_vptr_Context[0x80])
            (this->m_ctx,local_1f0,0,0,(ulong)(uint)(this->m_screen).m_width,
             (ulong)(uint)(this->m_screen).m_height);
  return;
}

Assistant:

void ContextArrayPack::render (Array::Primitive primitive, int firstVertex, int vertexCount, bool useVao, float coordScale, float colorScale)
{
	deUint32 program = 0;
	deUint32 vaoId = 0;

	updateProgram();

	m_ctx.viewport(0, 0, m_screen.getWidth(), m_screen.getHeight());
	m_ctx.clearColor(0.0, 0.0, 0.0, 1.0);
	m_ctx.clear(GL_COLOR_BUFFER_BIT);

	program = m_ctx.createProgram(m_program);

	m_ctx.useProgram(program);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glUseProgram()");

	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_coordScale"), coordScale);
	m_ctx.uniform1f(m_ctx.getUniformLocation(program, "u_colorScale"), colorScale);

	if (useVao)
	{
		m_ctx.genVertexArrays(1, &vaoId);
		m_ctx.bindVertexArray(vaoId);
	}

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());
			m_ctx.enableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glEnableVertexAttribArray()");

			m_arrays[arrayNdx]->glBind(loc);
		}
	}

	DE_ASSERT((firstVertex % 6) == 0);
	m_ctx.drawArrays(ContextArray::primitiveToGL(primitive), firstVertex, vertexCount - firstVertex);
	GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDrawArrays()");

	for (int arrayNdx = 0; arrayNdx < (int)m_arrays.size(); arrayNdx++)
	{
		if (m_arrays[arrayNdx]->isBound())
		{
			std::stringstream attribName;
			attribName << "a_" << m_arrays[arrayNdx]->getAttribNdx();

			deUint32 loc = m_ctx.getAttribLocation(program, attribName.str().c_str());

			m_ctx.disableVertexAttribArray(loc);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDisableVertexAttribArray()");
		}
	}

	if (useVao)
		m_ctx.deleteVertexArrays(1, &vaoId);

	m_ctx.deleteProgram(program);
	m_ctx.useProgram(0);
	m_ctx.readPixels(m_screen, 0, 0, m_screen.getWidth(), m_screen.getHeight());
}